

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O2

bool __thiscall
Assimp::X3DImporter::FindNodeElement
          (X3DImporter *this,string *pID,EType pType,CX3DImporter_NodeElement **pElement)

{
  CX3DImporter_NodeElement *pCVar1;
  __type _Var2;
  bool bVar3;
  bool bVar4;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *plVar5;
  CX3DImporter_NodeElement **ppCVar6;
  _List_node_base *p_Var7;
  
  ppCVar6 = &this->NodeElement_Cur;
  while( true ) {
    pCVar1 = *ppCVar6;
    if (pCVar1 == (CX3DImporter_NodeElement *)0x0) {
      bVar4 = FindNodeElement_FromRoot(this,pID,pType,pElement);
      return bVar4;
    }
    if ((pCVar1->Type == ENET_Group) &&
       (*(char *)&pCVar1[1].Child.
                  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                  ._M_impl._M_node.super__List_node_base._M_prev != '\0')) break;
    ppCVar6 = &pCVar1->Parent;
  }
  if ((pCVar1->Type == pType) && (_Var2 = std::operator==(&pCVar1->ID,pID), _Var2)) {
    if (pElement == (CX3DImporter_NodeElement **)0x0) {
      return true;
    }
    *pElement = pCVar1;
    return true;
  }
  plVar5 = &pCVar1->Child;
  p_Var7 = (_List_node_base *)plVar5;
  do {
    p_Var7 = (((_List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    bVar4 = p_Var7 != (_List_node_base *)plVar5;
    if (p_Var7 == (_List_node_base *)plVar5) {
      return bVar4;
    }
    bVar3 = FindNodeElement_FromNode
                      (this,(CX3DImporter_NodeElement *)p_Var7[1]._M_next,pID,pType,pElement);
  } while (!bVar3);
  return bVar4;
}

Assistant:

bool X3DImporter::FindNodeElement(const std::string& pID, const CX3DImporter_NodeElement::EType pType, CX3DImporter_NodeElement** pElement)
{
    CX3DImporter_NodeElement* tnd = NodeElement_Cur;// temporary pointer to node.
    bool static_search = false;// flag: true if searching in static node.

    // At first check if we have deal with static node. Go up through parent nodes and check flag.
    while(tnd != nullptr)
    {
		if(tnd->Type == CX3DImporter_NodeElement::ENET_Group)
		{
			if(((CX3DImporter_NodeElement_Group*)tnd)->Static)
			{
				static_search = true;// Flag found, stop walking up. Node with static flag will holded in tnd variable.
				break;
			}
		}

		tnd = tnd->Parent;// go up in graph.
    }// while(tnd != nullptr)

    // at now call appropriate search function.
    if ( static_search )
    {
        return FindNodeElement_FromNode( tnd, pID, pType, pElement );
    }
    else
    {
        return FindNodeElement_FromRoot( pID, pType, pElement );
    }
}